

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindExtensionFunction
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  size_type *psVar1;
  pointer puVar2;
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> oVar3;
  bool bVar4;
  ScalarFunctionInfo *pSVar5;
  type db;
  Catalog *this;
  BinderException *this_00;
  undefined8 in_RCX;
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> entry;
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  ScalarFunction local_158;
  
  pSVar5 = shared_ptr<duckdb::ScalarFunctionInfo,_true>::operator->
                     ((shared_ptr<duckdb::ScalarFunctionInfo,_true> *)
                      &arguments[0xb].
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  db = shared_ptr<duckdb::DatabaseInstance,_true>::operator*
                 ((shared_ptr<duckdb::DatabaseInstance,_true> *)
                  &(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                   name._M_string_length);
  bVar4 = ExtensionHelper::CanAutoloadExtension((string *)(pSVar5 + 1));
  if (bVar4) {
    ExtensionHelper::AutoLoadExtension(db,(string *)(pSVar5 + 1));
    this = Catalog::GetSystemCatalog(db);
    psVar1 = &local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_string_length;
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)psVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"main","");
    local_1a0 = Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                          (this,(ClientContext *)bound_function,(string *)&local_158,
                           (string *)
                           &(arguments->
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,THROW_EXCEPTION,
                           (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::CheckValid(&local_1a0);
    oVar3.ptr = local_1a0.ptr;
    if (local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (_func_int **)psVar1) {
      operator_delete(local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function);
    }
    ScalarFunctionSet::GetFunctionByArguments
              (&local_158,&(oVar3.ptr)->functions,(ClientContext *)bound_function,
               (vector<duckdb::LogicalType,_true> *)(arguments + 3));
    ScalarFunction::operator=((ScalarFunction *)arguments,&local_158);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_01993078;
    if (local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_158.function.super__Function_base._M_manager)
                ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor
                );
    }
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_019937c0;
    LogicalType::~LogicalType(&local_158.super_BaseScalarFunction.return_type);
    SimpleFunction::~SimpleFunction((SimpleFunction *)&local_158);
    puVar2 = arguments[8].
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (puVar2 == (pointer)0x0) {
      (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      (*(code *)puVar2)(context,bound_function,arguments,in_RCX);
    }
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       &local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length
  ;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "Trying to call function \"%s\" which is present in extension \"%s\" - but the extension is not loaded and could not be auto-loaded"
             ,"");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,puVar2,
             (long)&(puVar2->
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                    _M_t.
                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
             (long)&(((arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                    _M_t.
                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pSVar5[1]._vptr_ScalarFunctionInfo,
             (long)pSVar5[2]._vptr_ScalarFunctionInfo + (long)pSVar5[1]._vptr_ScalarFunctionInfo);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this_00,(string *)&local_158,&local_178,&local_198);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindExtensionFunction(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	// if this is triggered we are trying to call a method that is present in an extension
	// but the extension is not loaded
	// try to autoload the extension
	// first figure out which extension we need to auto-load
	auto &function_info = bound_function.function_info->Cast<ExtensionFunctionInfo>();
	auto &extension_name = function_info.extension;
	auto &db = *context.db;

	if (!ExtensionHelper::CanAutoloadExtension(extension_name)) {
		throw BinderException("Trying to call function \"%s\" which is present in extension \"%s\" - but the extension "
		                      "is not loaded and could not be auto-loaded",
		                      bound_function.name, extension_name);
	}
	// auto-load the extension
	ExtensionHelper::AutoLoadExtension(db, extension_name);

	// now find the function in the catalog
	auto &catalog = Catalog::GetSystemCatalog(db);
	auto &function_entry = catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, bound_function.name);
	// override the function with the extension function
	bound_function = function_entry.functions.GetFunctionByArguments(context, bound_function.arguments);
	// call the original bind (if any)
	if (!bound_function.bind) {
		return nullptr;
	}
	return bound_function.bind(context, bound_function, arguments);
}